

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom(MethodDescriptorProto *this,Message *from)

{
  MethodDescriptorProto *from_00;
  
  from_00 = (MethodDescriptorProto *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 != (MethodDescriptorProto *)0x0) {
    MergeFrom(this,from_00);
    return;
  }
  internal::ReflectionOps::Merge(from,&this->super_Message);
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.MethodDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  const MethodDescriptorProto* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<MethodDescriptorProto>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.MethodDescriptorProto)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.MethodDescriptorProto)
    MergeFrom(*source);
  }
}